

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraExec_cpp.h
# Opt level: O0

void __thiscall
moira::Moira::execMoveUspAn<(moira::Instr)76,(moira::Mode)12,(moira::Size)4>(Moira *this,u16 opcode)

{
  uint uVar1;
  ushort in_SI;
  Moira *in_RDI;
  int an;
  u32 in_stack_ffffffffffffffd8;
  int in_stack_ffffffffffffffdc;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  
  if (((in_RDI->reg).sr.s & 1U) == 0) {
    execPrivilegeException((Moira *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
  }
  else {
    uVar1 = in_SI & 7;
    prefetch<4ul>((Moira *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
    getUSP(in_RDI);
    writeA<(moira::Size)4>
              ((Moira *)CONCAT44(uVar1,in_stack_ffffffffffffffe0),in_stack_ffffffffffffffdc,
               in_stack_ffffffffffffffd8);
  }
  return;
}

Assistant:

void
Moira::execMoveUspAn(u16 opcode)
{
    SUPERVISOR_MODE_ONLY

    int an = _____________xxx(opcode);
    prefetch<POLLIPL>();
    writeA(an, getUSP());
}